

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.h
# Opt level: O1

void __thiscall CP::queue<int>::pop(queue<int> *this)

{
  out_of_range *this_00;
  
  if (this->mSize != 0) {
    this->mFront = (this->mFront + 1) % this->mCap;
    this->mSize = this->mSize - 1;
    return;
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this_00,"index of out range");
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

size_t size() const {
      return mSize;
    }